

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_send_disc(udp_ep *ep,udp_pipe *p,udp_disc_reason reason)

{
  nni_aio *aio;
  udp_sp_msg local_44;
  
  if (p->closed == false) {
    p->closed = true;
    aio = (nni_aio *)nni_list_first(&p->rx_aios);
    while (aio != (nni_aio *)0x0) {
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(&p->rx_aios);
    }
    local_44.data.us_sequence = p->self_seq;
    p->self_seq = local_44.data.us_sequence + 1;
    local_44._0_2_ = 0x301;
    local_44.data.us_type = ep->proto;
    local_44._4_4_ = p->self_id;
    local_44._8_4_ = p->peer_id;
    local_44.data.us_length = (uint16_t)reason;
    udp_queue_tx(ep,&p->peer_addr,&local_44,(nni_msg *)0x0);
  }
  return;
}

Assistant:

static void
udp_send_disc(udp_ep *ep, udp_pipe *p, udp_disc_reason reason)
{
	nni_aio *aio;
	if (p->closed) {
		return;
	}
	p->closed = true;
	while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	udp_send_disc_full(
	    ep, &p->peer_addr, p->self_id, p->peer_id, p->self_seq++, reason);
}